

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O1

bool __thiscall double_conversion::Bignum::ToHexString(Bignum *this,char *buffer,int buffer_size)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  char cVar8;
  Chunk CVar9;
  ulong uVar10;
  
  sVar1 = this->used_bigits_;
  if (sVar1 == 0) {
    if (1 < buffer_size) {
      buffer[0] = '0';
      buffer[1] = '\0';
      return true;
    }
    bVar2 = false;
  }
  else {
    CVar9 = this->bigits_buffer_[(long)(int)sVar1 + -1];
    iVar3 = 0;
    if (CVar9 != 0) {
      do {
        iVar3 = iVar3 + 1;
        bVar2 = 0xf < CVar9;
        CVar9 = CVar9 >> 4;
      } while (bVar2);
    }
    iVar3 = ((int)this->exponent_ + (int)sVar1) * 7 + -7 + iVar3;
    bVar2 = iVar3 < buffer_size;
    if (iVar3 < buffer_size) {
      iVar6 = iVar3 + -1;
      buffer[iVar3] = '\0';
      if (0 < this->exponent_) {
        pcVar4 = buffer + (long)iVar6 + -6;
        iVar3 = 0;
        do {
          builtin_strncpy(pcVar4,"0000000",7);
          iVar3 = iVar3 + 1;
          pcVar4 = pcVar4 + -7;
          iVar6 = iVar6 + -7;
        } while (iVar3 < this->exponent_);
      }
      if (this->used_bigits_ < 2) {
        uVar10 = (ulong)((int)this->used_bigits_ - 1);
      }
      else {
        lVar5 = 0;
        do {
          iVar3 = iVar6;
          uVar7 = this->bigits_buffer_[lVar5];
          pcVar4 = buffer + iVar3;
          iVar6 = 0;
          do {
            cVar8 = '7';
            if ((uVar7 & 0xf) < 10) {
              cVar8 = '0';
            }
            *pcVar4 = cVar8 + (char)(uVar7 & 0xf);
            uVar7 = uVar7 >> 4;
            iVar6 = iVar6 + 1;
            pcVar4 = pcVar4 + -1;
          } while (iVar6 != 7);
          lVar5 = lVar5 + 1;
          uVar10 = (long)this->used_bigits_ - 1;
          iVar6 = iVar3 + -7;
        } while (lVar5 < (long)uVar10);
        iVar6 = iVar3 + -7;
      }
      if (this->bigits_buffer_[(int)uVar10] != 0) {
        pcVar4 = buffer + iVar6;
        uVar7 = this->bigits_buffer_[(int)uVar10];
        do {
          cVar8 = '7';
          if ((uVar7 & 0xf) < 10) {
            cVar8 = '0';
          }
          *pcVar4 = cVar8 + (char)(uVar7 & 0xf);
          pcVar4 = pcVar4 + -1;
          bVar2 = 0xf < uVar7;
          uVar7 = uVar7 >> 4;
        } while (bVar2);
      }
      return true;
    }
  }
  return bVar2;
}

Assistant:

bool Bignum::ToHexString(char* buffer, const int buffer_size) const {
  DOUBLE_CONVERSION_ASSERT(IsClamped());
  // Each bigit must be printable as separate hex-character.
  DOUBLE_CONVERSION_ASSERT(kBigitSize % 4 == 0);
  static const int kHexCharsPerBigit = kBigitSize / 4;

  if (used_bigits_ == 0) {
    if (buffer_size < 2) {
      return false;
    }
    buffer[0] = '0';
    buffer[1] = '\0';
    return true;
  }
  // We add 1 for the terminating '\0' character.
  const int needed_chars = (BigitLength() - 1) * kHexCharsPerBigit +
    SizeInHexChars(RawBigit(used_bigits_ - 1)) + 1;
  if (needed_chars > buffer_size) {
    return false;
  }
  int string_index = needed_chars - 1;
  buffer[string_index--] = '\0';
  for (int i = 0; i < exponent_; ++i) {
    for (int j = 0; j < kHexCharsPerBigit; ++j) {
      buffer[string_index--] = '0';
    }
  }
  for (int i = 0; i < used_bigits_ - 1; ++i) {
    Chunk current_bigit = RawBigit(i);
    for (int j = 0; j < kHexCharsPerBigit; ++j) {
      buffer[string_index--] = HexCharOfValue(current_bigit & 0xF);
      current_bigit >>= 4;
    }
  }
  // And finally the last bigit.
  Chunk most_significant_bigit = RawBigit(used_bigits_ - 1);
  while (most_significant_bigit != 0) {
    buffer[string_index--] = HexCharOfValue(most_significant_bigit & 0xF);
    most_significant_bigit >>= 4;
  }
  return true;
}